

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRewrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  uint local_4c;
  uint local_48;
  int fPlaceEnable;
  int fVeryVerbose;
  int fVerbose;
  int fUseZeros;
  int fPrecompute;
  int fUpdateLevel;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fUseZeros = 1;
  bVar1 = false;
  fVeryVerbose = 0;
  fPlaceEnable = 0;
  local_48 = 0;
  local_4c = 0;
  Extra_UtilGetoptReset();
LAB_0026da81:
  iVar2 = Extra_UtilGetopt(argc,argv,"lxzvwh");
  if (iVar2 == -1) {
    if (bVar1) {
      Rwr_Precompute();
      pAbc_local._4_4_ = 0;
    }
    else if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar2 = Abc_NtkIsStrash(pNtk_00);
      if (iVar2 == 0) {
        Abc_Print(-1,"This command can only be applied to an AIG (run \"strash\").\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Abc_NtkGetChoiceNum(pNtk_00);
        if (iVar2 == 0) {
          iVar2 = Abc_NtkRewrite(pNtk_00,fUseZeros,fVeryVerbose,fPlaceEnable,local_48,local_4c);
          if (iVar2 == 0) {
            Abc_Print(-1,"Rewriting has failed.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            pAbc_local._4_4_ = 0;
          }
        }
        else {
          Abc_Print(-1,"AIG resynthesis cannot be applied to AIGs with choice nodes.\n");
          pAbc_local._4_4_ = 1;
        }
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x68:
    break;
  default:
    break;
  case 0x6c:
    fUseZeros = fUseZeros ^ 1;
    goto LAB_0026da81;
  case 0x70:
    local_4c = local_4c ^ 1;
    goto LAB_0026da81;
  case 0x76:
    fPlaceEnable = fPlaceEnable ^ 1;
    goto LAB_0026da81;
  case 0x77:
    local_48 = local_48 ^ 1;
    goto LAB_0026da81;
  case 0x78:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0026da81;
  case 0x7a:
    goto switchD_0026dabf_caseD_7a;
  }
  Abc_Print(-2,"usage: rewrite [-lzvwh]\n");
  Abc_Print(-2,"\t         performs technology-independent rewriting of the AIG\n");
  pcVar3 = "no";
  if (fUseZeros != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-l     : toggle preserving the number of levels [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fVeryVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-z     : toggle using zero-cost replacements [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fPlaceEnable != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (local_48 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-w     : toggle printout subgraph statistics [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_0026dabf_caseD_7a:
  fVeryVerbose = fVeryVerbose ^ 1;
  goto LAB_0026da81;
}

Assistant:

int Abc_CommandRewrite( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUpdateLevel;
    int fPrecompute;
    int fUseZeros;
    int fVerbose;
    int fVeryVerbose;
    int fPlaceEnable;
    // external functions
    extern void Rwr_Precompute();

    // set defaults
    fUpdateLevel = 1;
    fPrecompute  = 0;
    fUseZeros    = 0;
    fVerbose     = 0;
    fVeryVerbose = 0;
    fPlaceEnable = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lxzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'x':
            fPrecompute ^= 1;
            break;
        case 'z':
            fUseZeros ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'p':
            fPlaceEnable ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fPrecompute )
    {
        Rwr_Precompute();
        return 0;
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to an AIG (run \"strash\").\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( -1, "AIG resynthesis cannot be applied to AIGs with choice nodes.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkRewrite( pNtk, fUpdateLevel, fUseZeros, fVerbose, fVeryVerbose, fPlaceEnable ) )
    {
        Abc_Print( -1, "Rewriting has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: rewrite [-lzvwh]\n" );
    Abc_Print( -2, "\t         performs technology-independent rewriting of the AIG\n" );
    Abc_Print( -2, "\t-l     : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle using zero-cost replacements [default = %s]\n", fUseZeros? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printout subgraph statistics [default = %s]\n", fVeryVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-p     : toggle placement-aware rewriting [default = %s]\n", fPlaceEnable? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}